

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::rejectEnter
          (SPxSolverBase<double> *this,SPxId enterId,double enterTest,Status enterStat)

{
  LPRowSetBase<double> *pLVar1;
  int iVar2;
  VectorBase<double> *pVVar3;
  DataKey local_20;
  
  pLVar1 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>;
  if (0 < enterId.super_DataKey.info) {
    pLVar1 = (LPRowSetBase<double> *)&(this->super_SPxLPBase<double>).super_LPColSetBase<double>;
  }
  local_20 = enterId.super_DataKey;
  iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(pLVar1->super_SVSetBase<double>).set,&local_20);
  local_20.info = this->theRep * local_20.info;
  pVVar3 = &this->theCoTest;
  if (0 < local_20.info) {
    pVVar3 = &this->theTest;
  }
  (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = enterTest;
  (&(this->super_SPxBasisBase<double>).thedesc.stat)[local_20.info < 1]->data[iVar2] = enterStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectEnter(
   SPxId enterId,
   R enterTest,
   typename SPxBasisBase<R>::Desc::Status enterStat
)
{
   int enterIdx = this->number(enterId);

   if(isId(enterId))
   {
      theTest[enterIdx] = enterTest;
      this->desc().status(enterIdx) = enterStat;
   }
   else
   {
      theCoTest[enterIdx] = enterTest;
      this->desc().coStatus(enterIdx) = enterStat;
   }
}